

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileClasses.h
# Opt level: O2

void __thiscall
TextFile::writeFormat<unsigned_long,char_const*>
          (TextFile *this,char *text,unsigned_long *args,char **args_1)

{
  void *__buf;
  char **in_R8;
  string message;
  string local_30;
  
  tinyformat::format<unsigned_long,char_const*>
            (&local_30,(tinyformat *)text,(char *)args,(unsigned_long *)args_1,in_R8);
  write(this,(int)&local_30,__buf,(size_t)args_1);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void writeFormat(const char* text, const Args&... args)
	{
		std::string message = tfm::format(text,args...);
		write(message);
	}